

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O2

void __thiscall
deci::parser_t::value_type::move<deci::ast_arg_list_t*>(value_type *this,self_type *that)

{
  ast_arg_list_t **u;
  
  u = as<deci::ast_arg_list_t*>(that);
  emplace<deci::ast_arg_list_t*,deci::ast_arg_list_t*>(this,u);
  destroy<deci::ast_arg_list_t*>(that);
  return;
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }